

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O3

void __thiscall GuidedMeshNormalFiltering::initParameters(GuidedMeshNormalFiltering *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParameterSet *pPVar2;
  string local_40;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Denoise Type","");
  ParameterSet::addParameter(pPVar2,&local_40,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Face Neighbor","");
  ParameterSet::addParameter(pPVar2,&local_40,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"include central face","");
  ParameterSet::addParameter(pPVar2,&local_40,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Multiple(* avg face dis.)","");
  ParameterSet::addParameter(pPVar2,&local_40,2.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Multiple(* sigma_s)","");
  ParameterSet::addParameter(pPVar2,&local_40,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sigma_r","");
  ParameterSet::addParameter(pPVar2,&local_40,0.35);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"(Local)Normal Iteration Num.","");
  ParameterSet::addParameter(pPVar2,&local_40,0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"(Global)Normal Iteration Num.","");
  ParameterSet::addParameter(pPVar2,&local_40,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"smoothness","");
  ParameterSet::addParameter(pPVar2,&local_40,0.01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Vertex Iteration Num.","");
  ParameterSet::addParameter(pPVar2,&local_40,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("Denoise Type"), 0);


    parameter_set_->addParameter(string("Face Neighbor"), 0);
    parameter_set_->addParameter(string("include central face"), true);

    parameter_set_->addParameter(string("Multiple(* avg face dis.)"), 2.0);
    parameter_set_->addParameter(string("Multiple(* sigma_s)"), 1.0);

    parameter_set_->addParameter(string("sigma_r"), 0.35);

    parameter_set_->addParameter(string("(Local)Normal Iteration Num."), 20);
    parameter_set_->addParameter(string("(Global)Normal Iteration Num."), 1);

    parameter_set_->addParameter(string("smoothness"), 0.01);

    parameter_set_->addParameter(string("Vertex Iteration Num."), 10);
}